

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O2

ThreeAxisForceTorqueContactSensor * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::operator=
          (ThreeAxisForceTorqueContactSensor *this,ThreeAxisForceTorqueContactSensor *other)

{
  if (this != other) {
    ThreeAxisForceTorqueContactSensorPrivateAttributes::operator=(this->pimpl,other->pimpl);
  }
  return this;
}

Assistant:

ThreeAxisForceTorqueContactSensor& ThreeAxisForceTorqueContactSensor::operator=(const ThreeAxisForceTorqueContactSensor& other)
{
    if(this != &other)
    {
        *pimpl = *(other.pimpl);
    }
    return *this;
}